

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

ExprNodePtr __thiscall punky::par::Parser::parse_if_expression(Parser *this)

{
  _Alloc_hider _Var1;
  long lVar2;
  long *plVar3;
  Parser *in_RSI;
  bool bVar4;
  OptIfAltBlk alternative;
  unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_> consequence;
  ExprNodePtr condition;
  Token if_tok;
  undefined8 local_70;
  char local_68;
  undefined1 local_60 [8];
  undefined1 local_58 [8];
  undefined1 local_50 [8];
  undefined1 local_48 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  const_iterator local_30 [3];
  
  local_48._0_4_ = (in_RSI->m_curr_tok).m_type;
  local_30[2]._M_current._0_1_ = LeftParen;
  bVar4 = (in_RSI->m_curr_tok).m_literal.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged == true;
  if (bVar4) {
    local_40._M_allocated_capacity = (size_type)local_30;
    _Var1._M_p = (in_RSI->m_curr_tok).m_literal.
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._M_value._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_48 + 8),_Var1._M_p,
               _Var1._M_p +
               *(long *)((long)&(in_RSI->m_curr_tok).m_literal.
                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                ._M_payload.
                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ._M_payload + 8));
  }
  local_70 = (long *)((ulong)local_70._4_4_ << 0x20);
  local_30[2]._M_current._0_1_ = bVar4;
  bVar4 = expect_peek_and_consume(in_RSI,(TokenType *)&local_70);
  if (!bVar4) {
    (this->m_lex).m_line._M_dataplus._M_p = (pointer)0x0;
    goto LAB_0010e6e1;
  }
  consume(in_RSI);
  parse_expression((Parser *)local_50,(PrecedenceLevel)in_RSI);
  local_70 = (long *)CONCAT44(local_70._4_4_,1);
  bVar4 = expect_peek_and_consume(in_RSI,(TokenType *)&local_70);
  if (bVar4) {
    local_70 = (long *)CONCAT44(local_70._4_4_,4);
    bVar4 = expect_peek_and_consume(in_RSI,(TokenType *)&local_70);
    if (!bVar4) goto LAB_0010e6ca;
    parse_block_statement((Parser *)local_58);
    local_68 = '\0';
    plVar3 = local_70;
    if ((in_RSI->m_peek_tok).m_type == Else) {
      consume(in_RSI);
      local_60._0_4_ = LeftBrace;
      bVar4 = expect_peek_and_consume(in_RSI,(TokenType *)local_60);
      if (bVar4) {
        parse_block_statement((Parser *)local_60);
        if (local_68 == '\x01') {
          plVar3 = (long *)CONCAT44(local_60._4_4_,local_60._0_4_);
          if (local_70 != (long *)0x0) {
            lVar2 = *local_70;
            local_70 = (long *)CONCAT44(local_60._4_4_,local_60._0_4_);
            (**(code **)(lVar2 + 8))();
            plVar3 = local_70;
          }
        }
        else {
          local_68 = '\x01';
          plVar3 = (long *)CONCAT44(local_60._4_4_,local_60._0_4_);
        }
        goto LAB_0010e72c;
      }
      (this->m_lex).m_line._M_dataplus._M_p = (pointer)0x0;
    }
    else {
LAB_0010e72c:
      local_70 = plVar3;
      std::
      make_unique<punky::ast::IfExpression,punky::tok::Token&,std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>,std::unique_ptr<punky::ast::BlockStmt,std::default_delete<punky::ast::BlockStmt>>,std::optional<std::unique_ptr<punky::ast::BlockStmt,std::default_delete<punky::ast::BlockStmt>>>>
                ((Token *)local_60,
                 (unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_> *)
                 local_48,(unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>
                           *)local_50,
                 (optional<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>_>
                  *)local_58);
      (this->m_lex).m_line._M_dataplus._M_p = (pointer)CONCAT44(local_60._4_4_,local_60._0_4_);
    }
    if (local_68 == '\x01') {
      local_68 = '\0';
      if (local_70 != (long *)0x0) {
        (**(code **)(*local_70 + 8))();
      }
    }
    if (local_58 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_58 + 8))();
    }
  }
  else {
LAB_0010e6ca:
    (this->m_lex).m_line._M_dataplus._M_p = (pointer)0x0;
  }
  if (local_50 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_50 + 8))();
  }
LAB_0010e6e1:
  if (local_30[2]._M_current._0_1_ == RightParen) {
    local_30[2]._M_current._0_1_ = LeftParen;
    if ((const_iterator *)local_40._M_allocated_capacity != local_30) {
      operator_delete((void *)local_40._M_allocated_capacity,(ulong)(local_30[0]._M_current + 1));
    }
  }
  return (__uniq_ptr_data<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>,_true,_true>
          )(__uniq_ptr_data<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>,_true,_true>
            )this;
}

Assistant:

auto Parser::parse_if_expression() -> ast::ExprNodePtr
{
    auto if_tok = m_curr_tok;

    if (!expect_peek_and_consume(TokenType::LeftParen))
        return nullptr;
    consume();

    auto condition = parse_expression(PrecedenceLevel::Lowest);

    if (!expect_peek_and_consume(TokenType::RightParen))
        return nullptr;
    if (!expect_peek_and_consume(TokenType::LeftBrace))
        return nullptr;

    auto consequence = parse_block_statement();

    ast::OptIfAltBlk alternative;
    if (peek_type_is(TokenType::Else))
    {
        consume();
        if (!expect_peek_and_consume(TokenType::LeftBrace))
            return nullptr;

        alternative = parse_block_statement();
    }

    return std::make_unique<ast::IfExpression>(if_tok, std::move(condition),
                                               std::move(consequence), std::move(alternative));
}